

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O1

void __thiscall QRasterPaintEngine::fillRect(QRasterPaintEngine *this,QRectF *r,QSpanData *data)

{
  QRasterPaintEnginePrivate *this_00;
  QPaintEngineState *pQVar1;
  QPaintEnginePrivate *pQVar2;
  qreal qVar3;
  double dVar4;
  TransformationType TVar5;
  QPaintEngineState *pQVar6;
  long lVar7;
  QPaintEngineState *pQVar8;
  QTransform *pQVar9;
  QTransform *this_01;
  qreal *pqVar10;
  QRectF *this_02;
  QRect *r_00;
  long in_FS_OFFSET;
  byte bVar11;
  QPointF QVar12;
  qreal scale;
  QPainterPath path;
  QPointF local_88;
  QPointF local_78;
  undefined1 local_68 [16];
  double local_58;
  double dStack_50;
  undefined1 local_48 [12];
  Representation RStack_3c;
  long local_38;
  
  bVar11 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
  this_00 = (QRasterPaintEnginePrivate *)(this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
  pQVar8 = pQVar6 + -2;
  if (pQVar6 == (QPaintEngineState *)0x0) {
    pQVar8 = (QPaintEngineState *)0x0;
  }
  if ((pQVar8[0x105].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
       super_QFlagsStorage<QPaintEngine::DirtyFlag>.i & 8) == 0) {
    pQVar9 = (QTransform *)(pQVar8 + 0x36);
    this_01 = pQVar9;
    TVar5 = QTransform::type(pQVar9);
    if (TVar5 == TxScale) {
      r_00 = (QRect *)local_48;
      stack0xffffffffffffffc0 = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      this_02 = (QRectF *)local_68;
      QTransform::mapRect((QRectF *)local_68,pQVar9,r);
      _local_48 = toNormalizedFillRect((QRasterPaintEngine *)this_02,(QRectF *)local_68);
    }
    else if (TVar5 == TxTranslate) {
      r_00 = (QRect *)local_48;
      stack0xffffffffffffffc0 = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      dVar4 = r->yp + *(double *)(pQVar8 + 0x44);
      local_68._8_4_ = SUB84(dVar4,0);
      local_68._0_8_ = r->xp + *(double *)(pQVar8 + 0x42);
      local_68._12_4_ = (int)((ulong)dVar4 >> 0x20);
      local_58 = r->w;
      dStack_50 = r->h;
      _local_48 = toNormalizedFillRect((QRasterPaintEngine *)this_01,(QRectF *)local_68);
    }
    else {
      if (TVar5 != TxNone) goto LAB_003c16ce;
      local_68 = (undefined1  [16])toNormalizedFillRect((QRasterPaintEngine *)this_01,r);
      r_00 = (QRect *)local_68;
    }
    fillRect_normalized(r_00,data,this_00);
  }
  else {
LAB_003c16ce:
    pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
    pQVar6 = pQVar1 + -2;
    if (pQVar1 == (QPaintEngineState *)0x0) {
      pQVar6 = (QPaintEngineState *)0x0;
    }
    if (pQVar6[0x104].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
        super_QFlagsStorage<QPaintEngine::DirtyFlag>.i != 0) {
      updateRasterState(this);
    }
    if ((pQVar8[0x105].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
         super_QFlagsStorage<QPaintEngine::DirtyFlag>.i & 0x40) == 0) {
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QPainterPath::QPainterPath((QPainterPath *)local_48);
      QPainterPath::addRect((QPainterPath *)local_48,r);
      pQVar2 = (this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
      if (((ulong)pQVar2[10].baseSystemClip.d & 0x200000000) != 0) {
        qVar3 = pQVar2[3].systemTransform.m_matrix[0][1];
        pQVar6 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
        pQVar8 = pQVar6 + -2;
        if (pQVar6 == (QPaintEngineState *)0x0) {
          pQVar8 = (QPaintEngineState *)0x0;
        }
        pQVar9 = (QTransform *)(pQVar8 + 0x36);
        pqVar10 = (qreal *)((long)qVar3 + 0xf8);
        for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
          *pqVar10 = pQVar9->m_matrix[0][0];
          pQVar9 = (QTransform *)((long)pQVar9 + ((ulong)bVar11 * -2 + 1) * 8);
          pqVar10 = pqVar10 + (ulong)bVar11 * -2 + 1;
        }
        *(short *)((long)qVar3 + 0x140) =
             (short)pQVar8[0x48].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                    super_QFlagsStorage<QPaintEngine::DirtyFlag>.i;
        local_68._0_8_ = 0xffffffffffffffff;
        qt_scaleForTransform((QTransform *)(pQVar8 + 0x36),(qreal *)local_68);
        *(ulong *)((long)qVar3 + 0x148) =
             -(ulong)((double)local_68._0_8_ == 0.0) & 0x3fd0000000000000 |
             ~-(ulong)((double)local_68._0_8_ == 0.0) & (ulong)(0.25 / (double)local_68._0_8_);
      }
      (*(this->super_QPaintEngineEx).super_QPaintEngine._vptr_QPaintEngine[0x36])
                (this,(QPainterPath *)local_48,data);
      QPainterPath::~QPainterPath((QPainterPath *)local_48);
    }
    else {
      QRasterPaintEnginePrivate::initializeRasterizer(this_00,data);
      local_58 = -NAN;
      dStack_50 = -NAN;
      local_68._8_4_ = 0xffffffff;
      local_68._0_8_ = 0xffffffffffffffff;
      local_68._12_4_ = -1;
      QRectF::normalized();
      if ((0.0 < local_58) && (0.0 < dStack_50)) {
        local_48._8_4_ = 0xffffffff;
        local_48._0_4_ = -1;
        local_48._4_4_ = -1;
        RStack_3c.m_i = -1;
        local_78.xp = ((double)local_68._0_8_ + (double)local_68._0_8_) * 0.5;
        local_78.yp = (dStack_50 + (double)local_68._8_8_ + (double)local_68._8_8_) * 0.5;
        _local_48 = (QRect)QTransform::map((QTransform *)(pQVar8 + 0x36),&local_78);
        local_78.xp = -NAN;
        local_78.yp = -NAN;
        dVar4 = ((double)local_68._8_8_ + (double)local_68._8_8_ + dStack_50) * 0.5;
        local_88.yp._0_4_ = SUB84(dVar4,0);
        local_88.xp = ((double)local_68._0_8_ + local_58 + (double)local_68._0_8_ + local_58) * 0.5;
        local_88.yp._4_4_ = (int)((ulong)dVar4 >> 0x20);
        QVar12 = QTransform::map((QTransform *)(pQVar8 + 0x36),&local_88);
        local_78.xp = QVar12.xp;
        local_78.yp = QVar12.yp;
        QRasterizer::rasterizeLine
                  ((this_00->rasterizer).d,(QPointF *)local_48,&local_78,dStack_50 / local_58,false)
        ;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEngine::fillRect(const QRectF &r, QSpanData *data)
{
    Q_D(QRasterPaintEngine);
    QRasterPaintEngineState *s = state();

    if (!s->flags.antialiased) {
        uint txop = s->matrix.type();
        if (txop == QTransform::TxNone) {
            fillRect_normalized(toNormalizedFillRect(r), data, d);
            return;
        } else if (txop == QTransform::TxTranslate) {
            const QRect rr = toNormalizedFillRect(r.translated(s->matrix.dx(), s->matrix.dy()));
            fillRect_normalized(rr, data, d);
            return;
        } else if (txop == QTransform::TxScale) {
            const QRect rr = toNormalizedFillRect(s->matrix.mapRect(r));
            fillRect_normalized(rr, data, d);
            return;
        }
    }
    ensureRasterState();
    if (s->flags.tx_noshear) {
        d->initializeRasterizer(data);
        QRectF nr = r.normalized();
        if (!nr.isEmpty()) {
            const QPointF a = s->matrix.map((nr.topLeft() + nr.bottomLeft()) * 0.5f);
            const QPointF b = s->matrix.map((nr.topRight() + nr.bottomRight()) * 0.5f);
            d->rasterizer->rasterizeLine(a, b, nr.height() / nr.width());
        }
        return;
    }

    QPainterPath path;
    path.addRect(r);
    ensureOutlineMapper();
    fillPath(path, data);
}